

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O1

bool __thiscall Loader::writeBin(Loader *this,string *binFile,bool flash,string *loaderFile)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  undefined7 in_register_00000011;
  long lVar5;
  Loader *this_00;
  char *pcVar6;
  long *plVar7;
  string binStr;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  timespec local_40;
  
  if ((int)CONCAT71(in_register_00000011,flash) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Programming FPGA...",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    pcVar1 = (binFile->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar1,pcVar1 + binFile->_M_string_length);
    bVar2 = loadBin(this,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      plVar7 = &std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to initialize FPGA!",0x1a);
      bVar2 = false;
      goto LAB_00114091;
    }
  }
  else {
    this_00 = (Loader *)(binFile->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,this_00,
               (pointer)((long)&this_00->device + binFile->_M_string_length));
    fileToBinStr(&local_80,this_00,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initializing FPGA...",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    pcVar1 = (loaderFile->_M_dataplus)._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + loaderFile->_M_string_length);
    bVar2 = loadBin(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar2 = Jtag::setFreq(this->device,1500000.0);
      if (!bVar2) {
        lVar5 = 0x1d;
        pcVar6 = "Failed to set JTAG frequency!";
        goto LAB_00113ff6;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Erasing...",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      bVar2 = setIR(this,USER1);
      if (!bVar2) goto LAB_00114030;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"0","");
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
      bVar2 = shiftDR(this,1,&local_e0,&local_100,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) goto LAB_00114030;
      local_40.tv_sec = 0;
      local_40.tv_nsec = 100000000;
      do {
        iVar3 = nanosleep(&local_40,&local_40);
        if (iVar3 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing...",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      bVar2 = setIR(this,USER2);
      if (!bVar2) goto LAB_00114030;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
      bVar2 = shiftDR(this,(int)local_80._M_string_length << 2,&local_140,&local_160,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) goto LAB_00114030;
      this->currentState = TEST_LOGIC_RESET;
      bVar2 = Jtag::navigateToState(this->device,CAPTURE_DR,TEST_LOGIC_RESET);
      if (!bVar2) goto LAB_00114030;
      local_40.tv_sec = 100;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Resetting FPGA...",0x11);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      bVar2 = setIR(this,JPROGRAM);
    }
    else {
      lVar5 = 0x1a;
      pcVar6 = "Failed to initialize FPGA!";
LAB_00113ff6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
LAB_00114030:
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (bVar2 == false) {
      return false;
    }
  }
  this->currentState = TEST_LOGIC_RESET;
  bVar2 = Jtag::navigateToState(this->device,CAPTURE_DR,TEST_LOGIC_RESET);
  if (!bVar2) {
    return false;
  }
  plVar7 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
  bVar2 = true;
LAB_00114091:
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  return bVar2;
}

Assistant:

bool Loader::writeBin(string binFile, bool flash, string loaderFile) {
	if (flash) {
		string binStr = fileToBinStr(binFile);

		cout << "Initializing FPGA..." << endl;
		if (!loadBin(loaderFile)) {
			cerr << "Failed to initialize FPGA!" << endl;
			return false;
		}

		if (!device->setFreq(1500000)) {
			cerr << "Failed to set JTAG frequency!" << endl;
			return false;
		}

		cout << "Erasing..." << endl;

		// Erase the flash
		if (!setIR(USER1))
			return false;

		if (!shiftDR(1, "0", "", ""))
			return false;

		std::this_thread::sleep_for(std::chrono::milliseconds(100));

		cout << "Writing..." << endl;

		// Write the flash
		if (!setIR(USER2))
			return false;

		if (!shiftDR(binStr.length() * 4, binStr, "", ""))
			return false;

		// If you enter the reset state after a write
		// the loader firmware resets the flash into
		// regular SPI mode and gets stuck in a dead FSM
		// state. You need to do this before issuing a
		// JPROGRAM command or the FPGA can't read the
		// flash.
		if (!resetState())
			return false;

		std::this_thread::sleep_for(std::chrono::milliseconds(100)); // 100ms delay is required before issuing JPROGRAM

		cout << "Resetting FPGA..." << endl;
		// JPROGRAM resets the FPGA configuration and will
		// cause it to read the flash memory
		if (!setIR(JPROGRAM))
			return false;
	} else {
		cout << "Programming FPGA..." << endl;
		if (!loadBin(binFile)) {
			cerr << "Failed to initialize FPGA!" << endl;
			return false;
		}
	}

	// reset just for good measure
	if (!resetState())
		return false;

	cout << "Done." << endl;
	return true;
}